

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_raytracing_pipeline
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkRayTracingPipelineCreateInfoKHR **out_info)

{
  VkPipelineLibraryCreateInfoKHR **sub_info;
  uint uVar1;
  VkPipelineLibraryCreateInfoKHR *pVVar2;
  VkRayTracingShaderGroupCreateInfoKHR *__src;
  bool bVar3;
  VkRayTracingPipelineCreateInfoKHR *info;
  int *piVar4;
  VkPipeline pVVar5;
  VkPipeline *__dest;
  VkRayTracingShaderGroupCreateInfoKHR *pVVar6;
  bool bVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  long *in_FS_OFFSET;
  void *local_40;
  VkPipeline *local_38;
  
  info = (VkRayTracingPipelineCreateInfoKHR *)ScratchAllocator::allocate_raw(alloc,0x68,0x10);
  if (info != (VkRayTracingPipelineCreateInfoKHR *)0x0) {
    memmove(info,create_info,0x68);
  }
  info->flags = info->flags & 0x7ffffc3f;
  for (piVar4 = (int *)info->pNext; piVar4 != (int *)0x0; piVar4 = *(int **)(piVar4 + 2)) {
    if (*piVar4 == 0x3ba1f5f5) goto LAB_0012b4d5;
  }
  piVar4 = (int *)0x0;
LAB_0012b4d5:
  if (piVar4 != (int *)0x0) {
    info->flags = 0;
  }
  if ((info->flags & 4) == 0) {
    pVVar5 = (VkPipeline)0x0;
  }
  else {
    if (info->basePipelineHandle != (VkPipeline)0x0) goto LAB_0012b4fa;
    uVar1 = info->basePipelineIndex;
    if ((long)(int)uVar1 < 0) goto LAB_0012b4fa;
    if (base_pipeline_count <= uVar1) {
      if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
        bVar3 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
        if (bVar3) {
          return false;
        }
        copy_raytracing_pipeline();
      }
      return false;
    }
    pVVar5 = base_pipelines[(int)uVar1];
  }
  info->basePipelineHandle = pVVar5;
LAB_0012b4fa:
  info->basePipelineIndex = -1;
  bVar7 = false;
  bVar3 = copy_stages<VkRayTracingPipelineCreateInfoKHR>
                    (this,info,alloc,device,gsmcii,(DynamicStateInfo *)0x0);
  if (bVar3) {
    bVar7 = false;
    bVar3 = copy_dynamic_state<VkRayTracingPipelineCreateInfoKHR>
                      (this,info,alloc,(DynamicStateInfo *)0x0);
    if (bVar3) {
      sub_info = &info->pLibraryInfo;
      bVar7 = false;
      bVar3 = copy_sub_create_info<VkPipelineLibraryCreateInfoKHR>
                        (this,sub_info,alloc,(DynamicStateInfo *)0x0,0);
      if (bVar3) {
        bVar7 = false;
        bVar3 = copy_sub_create_info<VkRayTracingPipelineInterfaceCreateInfoKHR>
                          (this,&info->pLibraryInterface,alloc,(DynamicStateInfo *)0x0,0);
        if (bVar3) {
          pVVar2 = *sub_info;
          if (pVVar2 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
            if ((ulong)pVVar2->libraryCount == 0) {
              __dest = (VkPipeline *)0x0;
            }
            else {
              local_38 = pVVar2->pLibraries;
              sVar9 = (ulong)pVVar2->libraryCount << 3;
              __dest = (VkPipeline *)ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
              if (__dest != (VkPipeline *)0x0) {
                memmove(__dest,local_38,sVar9);
              }
            }
            (*sub_info)->pLibraries = __dest;
          }
          if ((ulong)info->groupCount == 0) {
            pVVar6 = (VkRayTracingShaderGroupCreateInfoKHR *)0x0;
          }
          else {
            __src = info->pGroups;
            sVar9 = (ulong)info->groupCount * 0x30;
            pVVar6 = (VkRayTracingShaderGroupCreateInfoKHR *)
                     ScratchAllocator::allocate_raw(alloc,sVar9,0x10);
            if (pVVar6 != (VkRayTracingShaderGroupCreateInfoKHR *)0x0) {
              memmove(pVVar6,__src,sVar9);
            }
          }
          info->pGroups = pVVar6;
          if (info->groupCount != 0) {
            lVar10 = 8;
            uVar8 = 0;
            do {
              pVVar6 = info->pGroups;
              local_40 = (void *)0x0;
              bVar3 = copy_pnext_chain(this,*(void **)((long)&pVVar6->sType + lVar10),alloc,
                                       &local_40,(DynamicStateInfo *)0x0,0);
              if (!bVar3) {
                return false;
              }
              *(void **)((long)&pVVar6->sType + lVar10) = local_40;
              *(undefined8 *)((long)&pVVar6->intersectionShader + lVar10) = 0;
              uVar8 = uVar8 + 1;
              lVar10 = lVar10 + 0x30;
            } while (uVar8 < info->groupCount);
          }
          bVar7 = false;
          bVar3 = copy_pnext_chain(this,info->pNext,alloc,&info->pNext,(DynamicStateInfo *)0x0,0);
          if (bVar3) {
            *out_info = info;
            bVar7 = true;
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool StateRecorder::Impl::copy_raytracing_pipeline(const VkRayTracingPipelineCreateInfoKHR *create_info,
                                                   ScratchAllocator &alloc, const VkPipeline *base_pipelines,
                                                   uint32_t base_pipeline_count,
                                                   VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                   VkRayTracingPipelineCreateInfoKHR **out_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_stages(info, alloc, device, gsmcii, nullptr))
		return false;
	if (!copy_dynamic_state(info, alloc, nullptr))
		return false;

	if (!copy_sub_create_info(info->pLibraryInfo, alloc, nullptr, 0))
		return false;
	if (!copy_sub_create_info(info->pLibraryInterface, alloc, nullptr, 0))
		return false;

	if (info->pLibraryInfo)
	{
		const_cast<VkPipelineLibraryCreateInfoKHR *>(info->pLibraryInfo)->pLibraries =
				copy(info->pLibraryInfo->pLibraries, info->pLibraryInfo->libraryCount, alloc);
	}

	info->pGroups = copy(info->pGroups, info->groupCount, alloc);
	for (uint32_t i = 0; i < info->groupCount; i++)
	{
		auto &group = const_cast<VkRayTracingShaderGroupCreateInfoKHR &>(info->pGroups[i]);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(group.pNext, alloc, &pNext, nullptr, 0))
			return false;
		group.pNext = pNext;
		group.pShaderGroupCaptureReplayHandle = nullptr;
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_info = info;
	return true;
}